

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O3

void __thiscall
QOpenGLTextureBlitterPrivate::QOpenGLTextureBlitterPrivate
          (QOpenGLTextureBlitterPrivate *this,QOpenGLTextureBlitter *q_ptr)

{
  undefined8 *puVar1;
  long lVar2;
  QOpenGLVertexArrayObject *this_00;
  
  this->q = q_ptr;
  QOpenGLBuffer::QOpenGLBuffer(&this->vertexBuffer);
  QOpenGLBuffer::QOpenGLBuffer(&this->textureBuffer);
  lVar2 = 0x40;
  do {
    *(undefined8 *)((long)this->programs + lVar2 + -0x1c) = 0;
    puVar1 = (undefined8 *)((long)this->programs + lVar2 + -0x40);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->programs + -1) + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined1 *)((long)this->programs + lVar2 + -0x20) = 0;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0xd0);
  this->swizzle = false;
  this->opacity = 1.0;
  this_00 = (QOpenGLVertexArrayObject *)operator_new(0x10);
  QOpenGLVertexArrayObject::QOpenGLVertexArrayObject(this_00,(QObject *)0x0);
  (this->vao).d = this_00;
  this->currentTarget = 0;
  return;
}

Assistant:

QOpenGLTextureBlitterPrivate(QOpenGLTextureBlitter *q_ptr) :
        q(q_ptr),
        swizzle(false),
        opacity(1.0f),
        vao(new QOpenGLVertexArrayObject),
        currentTarget(TEXTURE_2D)
    { }